

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O1

int mixed_make_segment_info(char *name,uint32_t *argc,mixed_segment_field_info **args)

{
  int iVar1;
  ulong uVar2;
  mixed_segment_field_info *pmVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = (ulong)segments.count;
  bVar5 = uVar2 != 0;
  if (bVar5) {
    pmVar3 = segments.entries[0].args;
    uVar4 = 1;
    do {
      if ((*(mixed_make_segment_function *)&pmVar3[-1].type_count !=
           (mixed_make_segment_function)0x0) &&
         (iVar1 = strcmp((char *)&pmVar3[-3].flags,name), iVar1 == 0)) {
        *argc = pmVar3[-1].flags;
        *args = pmVar3;
        if (bVar5) {
          return 1;
        }
        break;
      }
      bVar5 = uVar4 < uVar2;
      pmVar3 = (mixed_segment_field_info *)&pmVar3[0x22].flags;
      bVar6 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  mixed_err(0x18);
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_info(const char *name, uint32_t *argc, const struct mixed_segment_field_info **args){
  for(uint32_t i=0; i<segments.count; ++i){
    struct segment_entry *entry = &segments.entries[i];
    if(entry->function && strcmp(entry->name, name) == 0){
      *argc = entry->argc;
      *args = entry->args;
      return 1;
    }
  }
  mixed_err(MIXED_BAD_SEGMENT);
  return 0;
}